

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cpp
# Opt level: O1

int __thiscall r_memory_map::_get_posix_advice(r_memory_map *this,int advice)

{
  uint uVar1;
  
  uVar1 = 3;
  if ((advice & 4U) == 0) {
    uVar1 = advice & 3;
  }
  return uVar1 | (uint)advice >> 1 & 4;
}

Assistant:

int r_memory_map::_get_posix_advice(int advice) const
{
    int posixAdvice = 0;

    if(advice & MM_ADVICE_RANDOM)
        posixAdvice |= MADV_RANDOM;
    if(advice & MM_ADVICE_SEQUENTIAL)
        posixAdvice |= MADV_SEQUENTIAL;
    if(advice & MM_ADVICE_WILLNEED)
        posixAdvice |= MADV_WILLNEED;
    if(advice & MM_ADVICE_DONTNEED)
        posixAdvice |= MADV_DONTNEED;

    return posixAdvice;
}